

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fundamental.cc
# Opt level: O2

double sfm::sampson_distance(FundamentalMatrix *F,Correspondence2D2D *m)

{
  double dVar1;
  double dVar2;
  double local_38;
  double local_30;
  
  dVar1 = m->p1[0];
  dVar2 = m->p1[1];
  local_38 = F->m[0] * dVar1 + F->m[1] * dVar2 + F->m[2];
  dVar2 = dVar1 * F->m[6] + dVar2 * F->m[7] + F->m[8] +
          (F->m[3] * dVar1 + F->m[4] * dVar2 + F->m[5]) * m->p2[1] + m->p2[0] * local_38 + 0.0;
  local_30 = math::fastpow<double>(&local_38,2);
  local_30 = local_30 + 0.0;
  local_38 = m->p1[0] * F->m[3] + m->p1[1] * F->m[4] + F->m[5];
  dVar1 = math::fastpow<double>(&local_38,2);
  local_30 = dVar1 + local_30;
  local_38 = m->p2[0] * F->m[0] + m->p2[1] * F->m[3] + F->m[6];
  dVar1 = math::fastpow<double>(&local_38,2);
  local_30 = dVar1 + local_30;
  local_38 = m->p2[0] * F->m[1] + m->p2[1] * F->m[4] + F->m[7];
  dVar1 = math::fastpow<double>(&local_38,2);
  return (dVar2 * dVar2) / (dVar1 + local_30);
}

Assistant:

double
sampson_distance (FundamentalMatrix const& F, Correspondence2D2D const& m)
{
    /*
     * Computes the Sampson distance SD for a given match and fundamental
     * matrix. SD is computed as [Sect 11.4.3, Hartley, Zisserman]:
     *
     *   SD = (x'Fx)^2 / ( (Fx)_1^2 + (Fx)_2^2 + (x'F)_1^2 + (x'F)_2^2 )
     */

    double p2_F_p1 = 0.0;
    p2_F_p1 += m.p2[0] * (m.p1[0] * F[0] + m.p1[1] * F[1] + F[2]);
    p2_F_p1 += m.p2[1] * (m.p1[0] * F[3] + m.p1[1] * F[4] + F[5]);
    p2_F_p1 +=     1.0 * (m.p1[0] * F[6] + m.p1[1] * F[7] + F[8]);
    p2_F_p1 *= p2_F_p1;

    double sum = 0.0;
    sum += math::fastpow(m.p1[0] * F[0] + m.p1[1] * F[1] + F[2], 2);
    sum += math::fastpow(m.p1[0] * F[3] + m.p1[1] * F[4] + F[5], 2);
    sum += math::fastpow(m.p2[0] * F[0] + m.p2[1] * F[3] + F[6], 2);
    sum += math::fastpow(m.p2[0] * F[1] + m.p2[1] * F[4] + F[7], 2);

    return p2_F_p1 / sum;
}